

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall server_context::process_single_task(server_context *this,server_task *task)

{
  slot_state sVar1;
  pointer psVar2;
  _Map_pointer ppsVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pcVar8;
  uint64_t uVar9;
  int32_t *piVar10;
  server_context *psVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  server_slot *slot;
  server_slot *slot_00;
  common_log *pcVar14;
  long *plVar15;
  long lVar16;
  size_type sVar17;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type sVar20;
  size_t __n;
  undefined **ppuVar21;
  char *fmt;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  server_slot *slot_1;
  pointer psVar22;
  uint uVar23;
  int in_R8D;
  int iVar24;
  llama_tokens *this_00;
  int iVar25;
  size_type sVar26;
  bool bVar27;
  string filename;
  string filepath;
  size_t token_count;
  string local_c8;
  server_context *local_a0;
  undefined1 local_98 [40];
  string local_70;
  llama_context *local_50;
  llama_context *local_48;
  json_value jStack_40;
  
  switch(task->type) {
  case SERVER_TASK_TYPE_COMPLETION:
  case SERVER_TASK_TYPE_EMBEDDING:
  case SERVER_TASK_TYPE_RERANK:
  case SERVER_TASK_TYPE_INFILL:
    if (task->id_selected_slot == -1) {
      slot_00 = get_available_slot(this,task);
      if (slot_00 != (server_slot *)0x0) {
LAB_00192ddc:
        if (slot_00->state == SLOT_STATE_IDLE) {
          bVar27 = launch_slot_with_task(this,slot_00,task);
          if (bVar27) {
            return;
          }
          if (common_log_verbosity_thold < 0) {
            return;
          }
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,
                         "srv  %12.*s: failed to launch slot with task, id_task = %d\n",0xc,
                         "process_single_task",(ulong)(uint)task->id);
          return;
        }
LAB_00192de9:
        if (common_log_verbosity_thold < 1) goto LAB_00192e3c;
        goto LAB_00192df5;
      }
    }
    else {
      for (slot_00 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          slot_00 !=
          (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
          super__Vector_impl_data._M_finish; slot_00 = slot_00 + 1) {
        if (slot_00->id == task->id_selected_slot) goto LAB_00192ddc;
      }
    }
    if (common_log_verbosity_thold < 1) goto LAB_00192e3c;
    pcVar14 = common_log_main();
    uVar23 = task->id;
    fmt = "srv  %12.*s: no slot is available, defer task, id_task = %d\n";
    goto LAB_00192e21;
  case SERVER_TASK_TYPE_CANCEL:
    psVar22 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar22 != psVar2) {
      do {
        if (psVar22->id_task == task->id_target) {
          server_slot::release(psVar22);
          return;
        }
        psVar22 = psVar22 + 1;
      } while (psVar22 != psVar2);
    }
    break;
  case SERVER_TASK_TYPE_METRICS:
    iVar25 = 0;
    local_98._32_8_ = task;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c8,(initializer_list_t)ZEXT816(0),false,array);
    psVar22 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar23 = 0;
    local_a0 = this;
    if (psVar22 != psVar2) {
      uVar23 = 0;
      iVar25 = 0;
      do {
        server_slot::to_json_abi_cxx11_((server_slot *)local_98);
        sVar1 = psVar22->state;
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_c8,
                    (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)local_98);
        bVar27 = sVar1 == SLOT_STATE_IDLE;
        uVar23 = uVar23 + bVar27;
        iVar25 = iVar25 + (uint)!bVar27;
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)local_98,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_98);
        psVar22 = psVar22 + 1;
      } while (psVar22 != psVar2);
    }
    if (0 < common_log_verbosity_thold) {
      pcVar14 = common_log_main();
      common_log_add(pcVar14,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: n_idle_slots = %d, n_processing_slots = %d\n",0xc,
                     "process_single_task",(ulong)uVar23,iVar25);
    }
    plVar15 = (long *)operator_new(0x90);
    uVar12 = local_98._32_8_;
    plVar15[0x10] = 0;
    plVar15[0x11] = 0;
    plVar15[4] = 0;
    plVar15[5] = 0;
    plVar15[2] = 0;
    plVar15[3] = 0;
    plVar15[1] = -1;
    *plVar15 = (long)&PTR_is_error_002d8c40;
    plVar15[6] = 0;
    plVar15[7] = 0;
    plVar15[8] = 0;
    plVar15[9] = 0;
    plVar15[10] = 0;
    plVar15[0xb] = 0;
    plVar15[0xc] = 0;
    plVar15[0xd] = 0;
    plVar15[0xe] = 0;
    plVar15[0xf] = 0;
    iVar24 = 2;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)(plVar15 + 0x10),(initializer_list_t)ZEXT816(0),false,array);
    *(int *)(plVar15 + 1) = *(int *)uVar12;
    local_48 = (llama_context *)local_c8._M_dataplus._M_p;
    jStack_40 = (json_value)local_c8._M_string_length;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c8,false);
    local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffffffffff00;
    local_c8._M_string_length = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_48,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(plVar15 + 0x10),
                (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_48);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_48,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_48);
    psVar11 = local_a0;
    *(uint *)(plVar15 + 2) = uVar23;
    *(int *)((long)plVar15 + 0x14) = iVar25;
    ppsVar3 = (local_a0->queue_tasks).queue_tasks_deferred.
              super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    uVar23 = (int)((ulong)((long)ppsVar3 -
                          (long)(local_a0->queue_tasks).queue_tasks_deferred.
                                super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl
                                .super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppsVar3 == (_Map_pointer)0x0);
    __n = (size_t)uVar23;
    *(uint *)(plVar15 + 3) =
         (int)((ulong)((long)(local_a0->queue_tasks).queue_tasks_deferred.
                             super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                             super__Deque_impl_data._M_start._M_last -
                      (long)(local_a0->queue_tasks).queue_tasks_deferred.
                            super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur) >> 3) * 0x14b2a7c3 +
         (int)((ulong)((long)(local_a0->queue_tasks).queue_tasks_deferred.
                             super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur -
                      (long)(local_a0->queue_tasks).queue_tasks_deferred.
                            super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_first) >> 3) * 0x14b2a7c3 + uVar23;
    plVar15[4] = (local_a0->metrics).t_start;
    uVar13 = llama_kv_self_n_tokens(local_a0->ctx);
    *(undefined4 *)(plVar15 + 5) = uVar13;
    uVar13 = llama_kv_self_used_cells(psVar11->ctx);
    *(undefined4 *)((long)plVar15 + 0x2c) = uVar13;
    uVar9 = (psVar11->metrics).t_prompt_processing_total;
    plVar15[6] = (psVar11->metrics).n_prompt_tokens_processed_total;
    plVar15[7] = uVar9;
    uVar9 = (psVar11->metrics).t_tokens_generation_total;
    plVar15[8] = (psVar11->metrics).n_tokens_predicted_total;
    plVar15[9] = uVar9;
    uVar9 = (psVar11->metrics).t_prompt_processing;
    plVar15[10] = (psVar11->metrics).n_prompt_tokens_processed;
    plVar15[0xb] = uVar9;
    uVar9 = (psVar11->metrics).t_tokens_generation;
    plVar15[0xc] = (psVar11->metrics).n_tokens_predicted;
    plVar15[0xd] = uVar9;
    uVar9 = (psVar11->metrics).n_busy_slots_total;
    plVar15[0xe] = (psVar11->metrics).n_decode_total;
    plVar15[0xf] = uVar9;
    if (*(bool *)(local_98._32_8_ + 0x738) == true) {
      (psVar11->metrics).n_tokens_predicted = 0;
      (psVar11->metrics).t_tokens_generation = 0;
      (psVar11->metrics).n_prompt_tokens_processed = 0;
      (psVar11->metrics).t_prompt_processing = 0;
    }
    local_98._0_8_ = plVar15;
    server_response::send(&psVar11->queue_results,(int)local_98,__buf_00,__n,iVar24);
    if ((long *)local_98._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 0x28))();
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_c8,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_c8);
    break;
  case SERVER_TASK_TYPE_SLOT_SAVE:
    psVar22 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar22 != psVar2) {
      iVar25 = (task->slot_action).slot_id;
      do {
        if (psVar22->id == iVar25) {
          if (psVar22->state != SLOT_STATE_IDLE) goto joined_r0x001935cc;
          piVar5 = (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar6 = (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_98._32_8_ = ggml_time_us();
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar4 = (task->slot_action).filename._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar4,
                     pcVar4 + (task->slot_action).filename._M_string_length);
          local_98._0_8_ = local_98 + 0x10;
          pcVar4 = (task->slot_action).filepath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar4,
                     pcVar4 + (task->slot_action).filepath._M_string_length);
          sVar26 = (long)piVar5 - (long)piVar6 >> 2;
          sVar17 = sVar26;
          local_a0 = this;
          sVar20 = llama_state_seq_save_file
                             (this->ctx,local_98._0_8_,psVar22->id,
                              (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
          iVar24 = (int)sVar17;
          lVar16 = ggml_time_us();
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x50);
          (&paVar19->_M_allocated_capacity)[8] = 0;
          (&paVar19->_M_allocated_capacity)[9] = 0;
          (&paVar19->_M_allocated_capacity)[6] = 0;
          (&paVar19->_M_allocated_capacity)[7] = 0;
          (&paVar19->_M_allocated_capacity)[4] = 0;
          (&paVar19->_M_allocated_capacity)[5] = 0;
          ppuVar21 = &PTR_is_error_002d8cd8;
          paVar19->_M_allocated_capacity = (size_type)&PTR_is_error_002d8cd8;
          (&paVar19->_M_allocated_capacity)[2] = (size_type)(&paVar19->_M_allocated_capacity + 4);
          (&paVar19->_M_allocated_capacity)[3] = 0;
          *(int *)(&paVar19->_M_allocated_capacity + 1) = task->id;
          *(int *)((long)paVar19 + 0xc) = iVar25;
          std::__cxx11::string::_M_assign((string *)(&paVar19->_M_allocated_capacity + 2));
          *(undefined1 *)(&paVar19->_M_allocated_capacity + 6) = 1;
          (&paVar19->_M_allocated_capacity)[7] = sVar26;
          (&paVar19->_M_allocated_capacity)[8] = sVar20;
          (&paVar19->_M_allocated_capacity)[9] =
               (size_type)((double)(lVar16 - local_98._32_8_) / 1000.0);
          local_70._M_dataplus._M_p = (pointer)paVar19;
          server_response::send
                    (&local_a0->queue_results,(int)local_98 + 0x28,__buf_02,(size_t)ppuVar21,iVar24)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 0x28))();
          }
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
            return;
          }
          goto LAB_00193096;
        }
        psVar22 = psVar22 + 1;
      } while (psVar22 != psVar2);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Invalid slot ID","");
    send_error(this,task->id,&local_c8,ERROR_TYPE_INVALID_REQUEST);
    goto LAB_00193088;
  case SERVER_TASK_TYPE_SLOT_RESTORE:
    psVar22 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar22 != psVar2) {
      iVar25 = (task->slot_action).slot_id;
      this_00 = &psVar22->cache_tokens;
      do {
        if (((server_slot *)(this_00 + -0x53))->id == iVar25) {
          if (*(int *)((long)(this_00 + -6) + 8) != 0) goto LAB_00192de9;
          lVar16 = ggml_time_us();
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar4 = (task->slot_action).filename._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar4,
                     pcVar4 + (task->slot_action).filename._M_string_length);
          local_98._0_8_ = local_98 + 0x10;
          pcVar4 = (task->slot_action).filepath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar4,
                     pcVar4 + (task->slot_action).filepath._M_string_length);
          httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                    (this_00,(long)*(int *)(this_00 + -5));
          local_50 = (llama_context *)0x0;
          iVar24 = (int)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2);
          local_a0 = this;
          sVar17 = llama_state_seq_load_file
                             (this->ctx,local_98._0_8_,((server_slot *)(this_00 + -0x53))->id);
          if (sVar17 == 0) {
            httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,0);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_98 + 0x28),
                       "Unable to restore slot, no available space in KV cache or invalid slot save file"
                       ,"");
            send_error(local_a0,task->id,(string *)(local_98 + 0x28),ERROR_TYPE_INVALID_REQUEST);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                      (this_00,(size_type)local_50);
            lVar18 = ggml_time_us();
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(0x50);
            (&paVar19->_M_allocated_capacity)[8] = 0;
            (&paVar19->_M_allocated_capacity)[9] = 0;
            (&paVar19->_M_allocated_capacity)[6] = 0;
            (&paVar19->_M_allocated_capacity)[7] = 0;
            (&paVar19->_M_allocated_capacity)[4] = 0;
            (&paVar19->_M_allocated_capacity)[5] = 0;
            ppuVar21 = &PTR_is_error_002d8cd8;
            paVar19->_M_allocated_capacity = (size_type)&PTR_is_error_002d8cd8;
            (&paVar19->_M_allocated_capacity)[2] = (size_type)(&paVar19->_M_allocated_capacity + 4);
            (&paVar19->_M_allocated_capacity)[3] = 0;
            *(int *)(&paVar19->_M_allocated_capacity + 1) = task->id;
            *(int *)((long)paVar19 + 0xc) = iVar25;
            std::__cxx11::string::_M_assign((string *)(&paVar19->_M_allocated_capacity + 2));
            *(undefined1 *)(&paVar19->_M_allocated_capacity + 6) = 0;
            (&paVar19->_M_allocated_capacity)[7] = (size_type)local_50;
            (&paVar19->_M_allocated_capacity)[8] = sVar17;
            (&paVar19->_M_allocated_capacity)[9] = (size_type)((double)(lVar18 - lVar16) / 1000.0);
            local_70._M_dataplus._M_p = (pointer)paVar19;
            server_response::send
                      (&local_a0->queue_results,(int)local_98 + 0x28,__buf_01,(size_t)ppuVar21,
                       iVar24);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 0x28))();
            }
          }
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
            return;
          }
          goto LAB_00193096;
        }
        piVar10 = (int32_t *)(this_00 + 8);
        this_00 = (llama_tokens *)((long)(this_00 + 0x5b) + 8);
      } while ((pointer)(piVar10 + 2) != psVar2);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Invalid slot ID","");
    send_error(this,task->id,&local_c8,ERROR_TYPE_INVALID_REQUEST);
    goto LAB_00193088;
  case SERVER_TASK_TYPE_SLOT_ERASE:
    psVar22 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
              super__Vector_impl_data._M_start;
    psVar2 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar22 != psVar2) {
      iVar25 = (task->slot_action).slot_id;
      do {
        if (psVar22->id == iVar25) {
          if (psVar22->state != SLOT_STATE_IDLE) goto joined_r0x001935cc;
          piVar5 = (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar6 = (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          llama_kv_self_seq_rm(this->ctx,iVar25,0xffffffff,0xffffffff);
          piVar7 = (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish != piVar7) {
            (psVar22->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar7;
          }
          local_c8._M_dataplus._M_p = (pointer)operator_new(0x18);
          *(undefined ***)local_c8._M_dataplus._M_p = &PTR_is_error_002d8d18;
          uVar23 = task->id;
          *(uint *)((long)local_c8._M_dataplus._M_p + 8) = uVar23;
          *(int *)((long)local_c8._M_dataplus._M_p + 0xc) = iVar25;
          *(long *)((long)local_c8._M_dataplus._M_p + 0x10) = (long)piVar5 - (long)piVar6 >> 2;
          server_response::send(&this->queue_results,(int)&local_c8,__buf_03,(ulong)uVar23,in_R8D);
          goto LAB_0019300b;
        }
        psVar22 = psVar22 + 1;
      } while (psVar22 != psVar2);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Invalid slot ID","");
    send_error(this,task->id,&local_c8,ERROR_TYPE_INVALID_REQUEST);
LAB_00193088:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_00193096:
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    break;
  case SERVER_TASK_TYPE_SET_LORA:
    local_c8.field_2._M_allocated_capacity =
         (size_type)
         (this->params_base).lora_adapters.
         super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar8 = (task->set_lora).
             super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_c8._M_dataplus._M_p =
         (pointer)(this->params_base).lora_adapters.
                  super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_c8._M_string_length =
         (size_type)
         (this->params_base).lora_adapters.
         super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->params_base).lora_adapters.
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_start =
         (task->set_lora).
         super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->params_base).lora_adapters.
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar8;
    (this->params_base).lora_adapters.
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (task->set_lora).
         super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (task->set_lora).
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (task->set_lora).
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (task->set_lora).
    super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    httplib::detail::std::
    vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::~vector
              ((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *)
               &local_c8);
    local_c8._M_dataplus._M_p = (pointer)operator_new(0x10);
    *(undefined4 *)((long)local_c8._M_dataplus._M_p + 0xc) = 0xffffffff;
    *(undefined ***)local_c8._M_dataplus._M_p = &PTR_is_error_002d8d58;
    uVar23 = task->id;
    *(uint *)((long)local_c8._M_dataplus._M_p + 8) = uVar23;
    server_response::send(&this->queue_results,(int)&local_c8,__buf,(ulong)uVar23,in_R8D);
LAB_0019300b:
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_dataplus._M_p + 0x28))();
    }
  }
  return;
joined_r0x001935cc:
  if (common_log_verbosity_thold < 1) goto LAB_00192e3c;
LAB_00192df5:
  pcVar14 = common_log_main();
  uVar23 = task->id;
  fmt = "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n";
LAB_00192e21:
  common_log_add(pcVar14,GGML_LOG_LEVEL_DEBUG,fmt,0xc,"process_single_task",(ulong)uVar23);
LAB_00192e3c:
  server_queue::defer(&this->queue_tasks,task);
  return;
}

Assistant:

void process_single_task(server_task && task) {
        switch (task.type) {
            case SERVER_TASK_TYPE_COMPLETION:
            case SERVER_TASK_TYPE_INFILL:
            case SERVER_TASK_TYPE_EMBEDDING:
            case SERVER_TASK_TYPE_RERANK:
                {
                    const int id_slot = task.id_selected_slot;

                    server_slot * slot = id_slot != -1 ? get_slot_by_id(id_slot) : get_available_slot(task);

                    if (slot == nullptr) {
                        // if no slot is available, we defer this task for processing later
                        SRV_DBG("no slot is available, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    if (!launch_slot_with_task(*slot, std::move(task))) {
                        SRV_ERR("failed to launch slot with task, id_task = %d\n", task.id);
                        break;
                    }
                } break;
            case SERVER_TASK_TYPE_CANCEL:
                {
                    // release slot linked with the task id
                    for (auto & slot : slots) {
                        if (slot.id_task == task.id_target) {
                            slot.release();
                            break;
                        }
                    }
                } break;
            case SERVER_TASK_TYPE_NEXT_RESPONSE:
                {
                    // do nothing
                } break;
            case SERVER_TASK_TYPE_METRICS:
                {
                    json slots_data = json::array();

                    int n_idle_slots       = 0;
                    int n_processing_slots = 0;

                    for (server_slot & slot : slots) {
                        json slot_data = slot.to_json();

                        if (slot.is_processing()) {
                            n_processing_slots++;
                        } else {
                            n_idle_slots++;
                        }

                        slots_data.push_back(slot_data);
                    }
                    SRV_DBG("n_idle_slots = %d, n_processing_slots = %d\n", n_idle_slots, n_processing_slots);

                    auto res = std::make_unique<server_task_result_metrics>();
                    res->id                  = task.id;
                    res->slots_data          = std::move(slots_data);
                    res->n_idle_slots        = n_idle_slots;
                    res->n_processing_slots  = n_processing_slots;
                    res->n_tasks_deferred    = queue_tasks.queue_tasks_deferred.size();
                    res->t_start             = metrics.t_start;

                    res->kv_cache_tokens_count = llama_kv_self_n_tokens(ctx);
                    res->kv_cache_used_cells   = llama_kv_self_used_cells(ctx);

                    res->n_prompt_tokens_processed_total = metrics.n_prompt_tokens_processed_total;
                    res->t_prompt_processing_total       = metrics.t_prompt_processing_total;
                    res->n_tokens_predicted_total        = metrics.n_tokens_predicted_total;
                    res->t_tokens_generation_total       = metrics.t_tokens_generation_total;

                    res->n_prompt_tokens_processed = metrics.n_prompt_tokens_processed;
                    res->t_prompt_processing       = metrics.t_prompt_processing;
                    res->n_tokens_predicted        = metrics.n_tokens_predicted;
                    res->t_tokens_generation       = metrics.t_tokens_generation;

                    res->n_decode_total          = metrics.n_decode_total;
                    res->n_busy_slots_total      = metrics.n_busy_slots_total;

                    if (task.metrics_reset_bucket) {
                        metrics.reset_bucket();
                    }
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_SAVE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const size_t token_count = slot->cache_tokens.size();
                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    const size_t nwrite = llama_state_seq_save_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_save_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = true;
                    res->n_tokens = token_count;
                    res->n_bytes  = nwrite;
                    res->t_ms     = t_save_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_RESTORE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    slot->cache_tokens.resize(slot->n_ctx);
                    size_t token_count = 0;
                    size_t nread = llama_state_seq_load_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), slot->cache_tokens.size(), &token_count);
                    if (nread == 0) {
                        slot->cache_tokens.resize(0);
                        send_error(task, "Unable to restore slot, no available space in KV cache or invalid slot save file", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    slot->cache_tokens.resize(token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_restore_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = false;
                    res->n_tokens = token_count;
                    res->n_bytes  = nread;
                    res->t_ms     = t_restore_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_ERASE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    // Erase token cache
                    const size_t n_erased = slot->cache_tokens.size();
                    llama_kv_self_seq_rm(ctx, slot->id, -1, -1);
                    slot->cache_tokens.clear();

                    auto res = std::make_unique<server_task_result_slot_erase>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->n_erased = n_erased;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SET_LORA:
                {
                    params_base.lora_adapters = std::move(task.set_lora);
                    auto res = std::make_unique<server_task_result_apply_lora>();
                    res->id = task.id;
                    queue_results.send(std::move(res));
                } break;
        }
    }